

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  undefined1 (*pauVar1) [32];
  ImVec4 *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImVec2 IVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImVec2 IVar8;
  ImDrawVert *pIVar9;
  ImVec4 *pIVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  ulong uVar14;
  undefined8 *puVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ImDrawIdx IVar20;
  undefined1 (*pauVar21) [16];
  undefined7 in_register_00000081;
  ImDrawIdx *pIVar22;
  int iVar23;
  short sVar24;
  uint uVar25;
  ImDrawIdx IVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar46;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  float fVar47;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  float fVar53;
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  float fVar60;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  ImVec2 local_68 [2];
  ulong local_58;
  int local_50;
  undefined4 local_4c;
  int local_48;
  uint local_44;
  undefined1 (*local_40) [32];
  float local_38;
  byte local_31;
  
  auVar30._4_60_ = in_register_00001204;
  auVar30._0_4_ = thickness;
  if (points_count < 2) {
    return;
  }
  IVar8 = this->_Data->TexUvWhitePixel;
  local_68[0] = (ImVec2)(ulong)(points_count - 1U);
  local_68[1] = (ImVec2)(ulong)(points_count - 1U);
  if (closed) {
    local_68[1] = (ImVec2)(ulong)(uint)points_count;
  }
  local_40 = (undefined1 (*) [32])CONCAT44(local_40._4_4_,thickness);
  iVar23 = (int)SUB84(local_68[1],0);
  if ((this->Flags & 1U) == 0) {
    uStack_80 = 0x177d62;
    PrimReserve(this,iVar23 * 6,iVar23 * 4);
    for (uVar16 = 1; uVar16 - ((ulong)local_68[1] & 0xffffffff) != 1; uVar16 = uVar16 + 1) {
      uVar14 = uVar16 & 0xffffffff;
      if ((uint)points_count == uVar16) {
        uVar14 = 0;
      }
      fVar54 = points[uVar16 - 1].y;
      fVar46 = points[uVar14].x - points[uVar16 - 1].x;
      fVar53 = points[uVar14].y - fVar54;
      fVar37 = fVar46 * fVar46 + fVar53 * fVar53;
      auVar28 = ZEXT416((uint)fVar37);
      auVar31 = vsqrtss_avx(auVar28,auVar28);
      fVar60 = 1.0 / auVar31._0_4_;
      if (0.0 < fVar37) {
        fVar46 = fVar60 * fVar46;
      }
      auVar31 = vcmpss_avx(ZEXT816(0) << 0x40,auVar28,1);
      auVar31 = vblendvps_avx(ZEXT416((uint)fVar53),ZEXT416((uint)(fVar60 * fVar53)),auVar31);
      fVar46 = local_40._0_4_ * 0.5 * fVar46;
      fVar37 = local_40._0_4_ * 0.5 * auVar31._0_4_;
      pIVar9 = this->_VtxWritePtr;
      (pIVar9->pos).x = points[uVar16 - 1].x + fVar37;
      (pIVar9->pos).y = fVar54 - fVar46;
      pIVar9->uv = IVar8;
      pIVar9 = this->_VtxWritePtr;
      pIVar9->col = col;
      pIVar9[1].pos.x = fVar37 + points[uVar14].x;
      pIVar9[1].pos.y = points[uVar14].y - fVar46;
      pIVar9[1].uv = IVar8;
      pIVar9 = this->_VtxWritePtr;
      pIVar9[1].col = col;
      pIVar9[2].pos.x = points[uVar14].x - fVar37;
      pIVar9[2].pos.y = fVar46 + points[uVar14].y;
      pIVar9[2].uv = IVar8;
      pIVar9 = this->_VtxWritePtr;
      pIVar9[2].col = col;
      pIVar9[3].pos.x = points[uVar16 - 1].x - fVar37;
      pIVar9[3].pos.y = fVar46 + points[uVar16 - 1].y;
      pIVar9[3].uv = IVar8;
      pIVar9 = this->_VtxWritePtr;
      pIVar9[3].col = col;
      this->_VtxWritePtr = pIVar9 + 4;
      uVar27 = this->_VtxCurrentIdx;
      pIVar22 = this->_IdxWritePtr;
      IVar20 = (ImDrawIdx)uVar27;
      *pIVar22 = IVar20;
      pIVar22[1] = IVar20 + 1;
      pIVar22[2] = IVar20 + 2;
      pIVar22[3] = IVar20;
      pIVar22[4] = IVar20 + 2;
      pIVar22[5] = IVar20 + 3;
      this->_IdxWritePtr = pIVar22 + 6;
      this->_VtxCurrentIdx = uVar27 + 4;
    }
    return;
  }
  auVar31 = vmaxss_avx(auVar30._0_16_,SUB6416(ZEXT464(0x3f800000),0));
  local_38 = auVar31._0_4_;
  local_48 = (int)local_38;
  fVar54 = this->_FringeScale;
  local_31 = fVar54 == 1.0 & local_48 < 0x3f & (byte)this->Flags >> 1 &
             local_38 - (float)local_48 <= 1e-05;
  iVar11 = 0x12;
  if (thickness <= fVar54) {
    iVar11 = 0xc;
  }
  iVar12 = 6;
  if (local_31 == 0) {
    iVar12 = iVar11;
  }
  local_78 = ZEXT416((uint)fVar54);
  local_4c = (undefined4)CONCAT71(in_register_00000081,closed);
  if (local_31 == 1) {
    local_50 = points_count * 2;
    local_58 = 3;
  }
  else {
    local_50 = points_count * 3;
    if (fVar54 < thickness) {
      local_50 = points_count * 4;
    }
    local_58 = (ulong)((uint)(fVar54 < thickness) * 2 + 3);
  }
  local_44 = col & 0xffffff;
  uStack_80 = 0x177fac;
  PrimReserve(this,iVar12 * iVar23,local_50);
  auVar31 = _DAT_001dd840;
  lVar18 = -((ulong)(uint)((int)local_58 * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar15 = (undefined8 *)(local_78 + lVar18);
  uVar14 = (ulong)(uint)points_count;
  lVar17 = -((ulong)local_68[1] & 0xffffffff);
  *(undefined8 *)(local_78 + lVar18 + -8) = 1;
  bVar13 = local_31;
  for (uVar16 = *(ulong *)(local_78 + lVar18 + -8); lVar17 + uVar16 != 1; uVar16 = uVar16 + 1) {
    uVar19 = uVar16 & 0xffffffff;
    if (uVar14 == uVar16) {
      uVar19 = 0;
    }
    fVar37 = points[uVar19].x - points[uVar16 - 1].x;
    fVar46 = points[uVar19].y - points[uVar16 - 1].y;
    fVar54 = fVar37 * fVar37 + fVar46 * fVar46;
    auVar41 = ZEXT416((uint)fVar54);
    auVar28 = vsqrtss_avx(auVar41,auVar41);
    fVar53 = 1.0 / auVar28._0_4_;
    if (0.0 < fVar54) {
      fVar37 = fVar37 * fVar53;
    }
    auVar28 = vcmpss_avx(ZEXT816(0) << 0x40,auVar41,1);
    auVar28 = vblendvps_avx(ZEXT416((uint)fVar46),ZEXT416((uint)(fVar46 * fVar53)),auVar28);
    *(int *)(local_78 + uVar16 * 8 + lVar18 + -8) = auVar28._0_4_;
    *(float *)(local_78 + uVar16 * 8 + lVar18 + -4) = -fVar37;
  }
  pauVar1 = (undefined1 (*) [32])(puVar15 + uVar14);
  fVar54 = (float)local_78._0_4_;
  if ((char)local_4c == '\0') {
    uVar16 = (ulong)local_68[0] & 0xffffffff;
    puVar15[uVar16] = *(undefined8 *)((long)pauVar1[-1] + 0x10);
    IVar5 = points[uVar16];
    auVar28._8_8_ = 0;
    auVar28._0_4_ = IVar5.x;
    auVar28._4_4_ = IVar5.y;
    fVar37 = IVar5.x;
    fVar46 = IVar5.y;
    if (local_40._0_4_ <= (float)local_78._0_4_ || bVar13 != 0) {
      if (bVar13 != 0) {
        fVar54 = local_38 * 0.5 + 1.0;
      }
      auVar31._0_4_ = fVar54 * (float)*puVar15;
      auVar31._4_4_ = fVar54 * (float)((ulong)*puVar15 >> 0x20);
      auVar31._8_4_ = fVar54 * 0.0;
      auVar31._12_4_ = fVar54 * 0.0;
      IVar5 = *points;
      auVar39._8_8_ = 0;
      auVar39._0_4_ = IVar5.x;
      auVar39._4_4_ = IVar5.y;
      auVar48._0_4_ = auVar31._0_4_ + IVar5.x;
      auVar48._4_4_ = auVar31._4_4_ + IVar5.y;
      auVar48._8_4_ = auVar31._8_4_ + 0.0;
      auVar48._12_4_ = auVar31._12_4_ + 0.0;
      auVar31 = vsubps_avx(auVar39,auVar31);
      auVar31 = vmovlhps_avx(auVar48,auVar31);
      *(undefined1 (*) [16])*pauVar1 = auVar31;
      auVar32._0_4_ = fVar54 * (float)puVar15[uVar16] + fVar37;
      auVar32._4_4_ = fVar54 * (float)((ulong)puVar15[uVar16] >> 0x20) + fVar46;
      auVar32._8_4_ = fVar54 * 0.0 + 0.0;
      auVar32._12_4_ = fVar54 * 0.0 + 0.0;
      uVar19 = (ulong)(uint)((int)local_68[0].x * 2);
      uVar38 = vmovlps_avx(auVar32);
      *(undefined8 *)((long)*pauVar1 + uVar19 * 8) = uVar38;
      auVar33._0_4_ = fVar54 * (float)puVar15[uVar16];
      auVar33._4_4_ = fVar54 * (float)((ulong)puVar15[uVar16] >> 0x20);
      auVar33._8_4_ = fVar54 * 0.0;
      auVar33._12_4_ = fVar54 * 0.0;
      auVar31 = vsubps_avx(auVar28,auVar33);
      local_40 = pauVar1;
      uVar38 = vmovlps_avx(auVar31);
      *(undefined8 *)((long)*pauVar1 + (uVar19 + 1) * 8) = uVar38;
      goto LAB_00178144;
    }
    fVar53 = (local_38 - (float)local_78._0_4_) * 0.5;
    fVar54 = (float)local_78._0_4_ + fVar53;
    auVar35._4_4_ = fVar54;
    auVar35._0_4_ = fVar54;
    auVar35._8_4_ = fVar54;
    auVar35._12_4_ = fVar54;
    fVar60 = (float)*puVar15;
    auVar51._0_4_ = fVar60 * fVar54;
    fVar47 = (float)((ulong)*puVar15 >> 0x20);
    auVar51._4_4_ = fVar47 * fVar54;
    auVar51._8_4_ = fVar54 * 0.0;
    auVar51._12_4_ = fVar54 * 0.0;
    IVar5 = *points;
    auVar56._8_8_ = 0;
    auVar56._0_4_ = IVar5.x;
    auVar56._4_4_ = IVar5.y;
    auVar45._4_4_ = auVar51._4_4_ + IVar5.y;
    auVar45._0_4_ = auVar51._0_4_ + IVar5.x;
    auVar45._8_4_ = auVar51._8_4_ + 0.0;
    auVar45._12_4_ = auVar51._12_4_ + 0.0;
    auVar36._4_4_ = fVar53;
    auVar36._0_4_ = fVar53;
    auVar36._8_4_ = fVar53;
    auVar36._12_4_ = fVar53;
    auVar40._0_4_ = fVar53 * fVar60;
    auVar40._4_4_ = fVar53 * fVar47;
    auVar40._8_4_ = fVar53 * 0.0;
    auVar40._12_4_ = fVar53 * 0.0;
    auVar52._4_4_ = auVar40._4_4_ + IVar5.y;
    auVar52._0_4_ = auVar40._0_4_ + IVar5.x;
    auVar52._8_4_ = auVar40._8_4_ + 0.0;
    auVar52._12_4_ = auVar40._12_4_ + 0.0;
    auVar41 = vsubps_avx(auVar56,auVar51);
    auVar52._16_16_ = auVar41;
    auVar41 = vsubps_avx(auVar56,auVar40);
    auVar45._16_16_ = auVar41;
    auVar45 = vunpcklpd_avx(auVar45,auVar52);
    *pauVar1 = auVar45;
    auVar41._0_4_ = fVar54 * (float)puVar15[uVar16] + fVar37;
    auVar41._4_4_ = fVar54 * (float)((ulong)puVar15[uVar16] >> 0x20) + fVar46;
    auVar41._8_4_ = fVar54 * 0.0 + 0.0;
    auVar41._12_4_ = fVar54 * 0.0 + 0.0;
    uVar19 = (ulong)(uint)((int)local_68[0].x << 2);
    uVar38 = vmovlps_avx(auVar41);
    *(undefined8 *)((long)*pauVar1 + uVar19 * 8) = uVar38;
    auVar42._0_4_ = fVar37 + fVar53 * (float)puVar15[uVar16];
    auVar42._4_4_ = fVar46 + fVar53 * (float)((ulong)puVar15[uVar16] >> 0x20);
    auVar42._8_4_ = fVar53 * 0.0 + 0.0;
    auVar42._12_4_ = fVar53 * 0.0 + 0.0;
    uVar38 = vmovlps_avx(auVar42);
    *(undefined8 *)((long)*pauVar1 + (uVar19 + 1) * 8) = uVar38;
    auVar43._0_4_ = fVar53 * (float)puVar15[uVar16];
    auVar43._4_4_ = fVar53 * (float)((ulong)puVar15[uVar16] >> 0x20);
    auVar43._8_4_ = fVar53 * 0.0;
    auVar43._12_4_ = fVar53 * 0.0;
    auVar41 = vsubps_avx(auVar28,auVar43);
    uVar38 = vmovlps_avx(auVar41);
    *(undefined8 *)((long)*pauVar1 + (uVar19 + 2) * 8) = uVar38;
    auVar44._0_4_ = fVar54 * (float)puVar15[uVar16];
    auVar44._4_4_ = fVar54 * (float)((ulong)puVar15[uVar16] >> 0x20);
    auVar44._8_4_ = fVar54 * 0.0;
    auVar44._12_4_ = fVar54 * 0.0;
    auVar28 = vsubps_avx(auVar28,auVar44);
    uVar38 = vmovlps_avx(auVar28);
    *(undefined8 *)((long)*pauVar1 + (uVar19 + 3) * 8) = uVar38;
    auVar28 = vblendps_avx(auVar35,auVar36,2);
  }
  else {
    if (local_40._0_4_ <= (float)local_78._0_4_ || bVar13 != 0) {
      if (bVar13 != 0) {
        fVar54 = local_38 * 0.5 + 1.0;
      }
      local_40 = pauVar1;
LAB_00178144:
      uVar27 = this->_VtxCurrentIdx;
      pIVar22 = this->_IdxWritePtr;
      *(undefined8 *)(local_78 + lVar18 + -8) = 1;
      for (uVar16 = *(ulong *)(local_78 + lVar18 + -8); lVar17 + uVar16 != 1; uVar16 = uVar16 + 1) {
        uVar19 = uVar16 & 0xffffffff;
        if (uVar14 == uVar16) {
          uVar19 = 0;
        }
        uVar25 = uVar27 + (bVar13 ^ 3);
        if (uVar14 == uVar16) {
          uVar25 = this->_VtxCurrentIdx;
        }
        fVar37 = ((float)*(undefined8 *)(local_78 + uVar16 * 8 + lVar18 + -8) +
                 (float)puVar15[uVar19]) * 0.5;
        fVar46 = ((float)((ulong)*(undefined8 *)(local_78 + uVar16 * 8 + lVar18 + -8) >> 0x20) +
                 (float)((ulong)puVar15[uVar19] >> 0x20)) * 0.5;
        auVar49._0_4_ = fVar37 * fVar37;
        auVar49._4_4_ = fVar46 * fVar46;
        auVar49._8_8_ = 0;
        auVar31 = vmovshdup_avx(auVar49);
        IVar5 = points[uVar19];
        auVar55._8_4_ = IVar5.x;
        auVar55._12_4_ = IVar5.y;
        auVar55._0_4_ = IVar5.x;
        auVar55._4_4_ = IVar5.y;
        auVar31 = vmaxss_avx(SUB6416(ZEXT464(0x3f000000),0),
                             ZEXT416((uint)(fVar37 * fVar37 + auVar31._0_4_)));
        fVar53 = 1.0 / auVar31._0_4_;
        fVar37 = fVar54 * fVar37 * fVar53;
        fVar46 = fVar54 * fVar46 * fVar53;
        uVar38 = CONCAT44(fVar46,fVar37);
        auVar50._8_8_ = uVar38;
        auVar50._0_8_ = uVar38;
        auVar31 = vsubps_avx(auVar55,auVar50);
        *(undefined8 *)((long)*local_40 + (ulong)(uint)((int)uVar19 * 2) * 8) =
             CONCAT44(IVar5.y + fVar46,IVar5.x + fVar37);
        ((undefined8 *)((long)*local_40 + (ulong)(uint)((int)uVar19 * 2) * 8))[1] = auVar31._8_8_;
        IVar20 = (ImDrawIdx)uVar25;
        *pIVar22 = IVar20;
        IVar26 = (ImDrawIdx)uVar27;
        pIVar22[1] = IVar26;
        if (local_31 == 0) {
          pIVar22[2] = IVar26 + 2;
          pIVar22[3] = IVar26 + 2;
          pIVar22[4] = IVar20 + 2;
          pIVar22[5] = IVar20;
          pIVar22[6] = IVar20 + 1;
          pIVar22[7] = IVar26 + 1;
          pIVar22[8] = IVar26;
          pIVar22[9] = IVar26;
          pIVar22[10] = IVar20;
          pIVar22[0xb] = IVar20 + 1;
          *(undefined8 *)(local_78 + lVar18 + -8) = 0x18;
        }
        else {
          pIVar22[2] = IVar26 + 1;
          pIVar22[3] = IVar20 + 1;
          pIVar22[4] = IVar26 + 1;
          pIVar22[5] = IVar20;
          *(undefined8 *)(local_78 + lVar18 + -8) = 0xc;
        }
        pIVar22 = (ImDrawIdx *)((long)pIVar22 + *(long *)(local_78 + lVar18 + -8));
        this->_IdxWritePtr = pIVar22;
        uVar27 = uVar25;
      }
      if (local_31 == 0) {
        for (lVar18 = 0; uVar14 * 8 - lVar18 != 0; lVar18 = lVar18 + 8) {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar18);
          this->_VtxWritePtr->uv = IVar8;
          pIVar9 = this->_VtxWritePtr;
          pIVar9->col = col;
          pIVar9[1].pos = *(ImVec2 *)((long)puVar15 + lVar18 * 2 + uVar14 * 8);
          this->_VtxWritePtr[1].uv = IVar8;
          pIVar9 = this->_VtxWritePtr;
          pIVar9[1].col = local_44;
          pIVar9[2].pos = *(ImVec2 *)((long)puVar15 + lVar18 * 2 + uVar14 * 8 + 8);
          this->_VtxWritePtr[2].uv = IVar8;
          pIVar9 = this->_VtxWritePtr;
          pIVar9[2].col = local_44;
          this->_VtxWritePtr = pIVar9 + 3;
        }
      }
      else {
        pIVar10 = this->_Data->TexUvLines;
        pIVar2 = pIVar10 + local_48;
        uVar3 = pIVar2->x;
        uVar6 = pIVar2->y;
        auVar29._4_4_ = uVar6;
        auVar29._0_4_ = uVar3;
        auVar29._8_8_ = 0;
        pIVar10 = pIVar10 + local_48;
        uVar4 = pIVar10->z;
        uVar7 = pIVar10->w;
        auVar34._4_4_ = uVar7;
        auVar34._0_4_ = uVar4;
        auVar34._8_8_ = 0;
        for (lVar18 = 0; uVar14 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar15 + lVar18 + uVar14 * 8);
          IVar8 = (ImVec2)vmovlps_avx(auVar29);
          this->_VtxWritePtr->uv = IVar8;
          pIVar9 = this->_VtxWritePtr;
          pIVar9->col = col;
          pIVar9[1].pos = *(ImVec2 *)((long)puVar15 + lVar18 + uVar14 * 8 + 8);
          IVar8 = (ImVec2)vmovlps_avx(auVar34);
          this->_VtxWritePtr[1].uv = IVar8;
          pIVar9 = this->_VtxWritePtr;
          pIVar9[1].col = col;
          this->_VtxWritePtr = pIVar9 + 2;
        }
      }
      goto LAB_001785f0;
    }
    fVar54 = (local_38 - (float)local_78._0_4_) * 0.5;
    auVar28 = vinsertps_avx(ZEXT416((uint)((float)local_78._0_4_ + fVar54)),ZEXT416((uint)fVar54),
                            0x10);
  }
  auVar28 = vshufps_avx(auVar28,auVar28,0x50);
  uVar27 = this->_VtxCurrentIdx;
  pauVar21 = (undefined1 (*) [16])this->_IdxWritePtr;
  *(undefined8 *)(local_78 + lVar18 + -8) = 1;
  for (uVar16 = *(ulong *)(local_78 + lVar18 + -8); lVar17 + uVar16 != 1; uVar16 = uVar16 + 1) {
    uVar19 = uVar16 & 0xffffffff;
    uVar25 = uVar27 + 4;
    if (uVar14 == uVar16) {
      uVar19 = 0;
      uVar25 = this->_VtxCurrentIdx;
    }
    fVar54 = ((float)*(undefined8 *)(local_78 + uVar16 * 8 + lVar18 + -8) + (float)puVar15[uVar19])
             * 0.5;
    fVar46 = ((float)((ulong)*(undefined8 *)(local_78 + uVar16 * 8 + lVar18 + -8) >> 0x20) +
             (float)((ulong)puVar15[uVar19] >> 0x20)) * 0.5;
    auVar58._0_4_ = fVar54 * fVar54;
    auVar58._4_4_ = fVar46 * fVar46;
    auVar58._8_8_ = 0;
    auVar41 = vmovshdup_avx(auVar58);
    IVar5 = points[uVar19];
    auVar59._8_4_ = IVar5.x;
    auVar59._12_4_ = IVar5.y;
    auVar59._0_4_ = IVar5.x;
    auVar59._4_4_ = IVar5.y;
    auVar59._16_4_ = IVar5.x;
    auVar59._20_4_ = IVar5.y;
    auVar59._24_4_ = IVar5.x;
    auVar59._28_4_ = IVar5.y;
    auVar41 = vmaxss_avx(SUB6416(ZEXT464(0x3f000000),0),
                         ZEXT416((uint)(fVar54 * fVar54 + auVar41._0_4_)));
    fVar60 = 1.0 / auVar41._0_4_;
    fVar37 = auVar28._0_4_ * fVar54 * fVar60;
    fVar53 = auVar28._4_4_ * fVar46 * fVar60;
    fVar54 = auVar28._8_4_ * fVar54 * fVar60;
    fVar46 = auVar28._12_4_ * fVar46 * fVar60;
    auVar45 = vpermpd_avx2(ZEXT1632(CONCAT412(fVar46,CONCAT48(fVar54,CONCAT44(fVar53,fVar37)))),0x14
                          );
    fVar60 = IVar5.x;
    auVar57._0_4_ = fVar60 + fVar37;
    fVar37 = IVar5.y;
    auVar57._4_4_ = fVar37 + fVar53;
    auVar57._8_4_ = fVar60 + fVar54;
    auVar57._12_4_ = fVar37 + fVar46;
    auVar57._16_4_ = fVar60 + 0.0;
    auVar57._20_4_ = fVar37 + 0.0;
    auVar57._24_4_ = fVar60 + 0.0;
    auVar57._28_4_ = fVar37 + 0.0;
    auVar45 = vsubps_avx(auVar59,auVar45);
    auVar45 = vblendps_avx(auVar57,auVar45,0xf0);
    *(undefined1 (*) [32])((long)*pauVar1 + (ulong)(uint)((int)uVar19 << 2) * 8) = auVar45;
    auVar41 = vpinsrw_avx(ZEXT416(uVar25),uVar27,1);
    auVar41 = vpshuflw_avx(auVar41,0x14);
    auVar41 = vpaddw_avx(auVar41,ZEXT816(0x2000200010001));
    auVar35 = vpshufb_avx(auVar41,auVar31);
    *pauVar21 = auVar35;
    sVar24 = (short)uVar27;
    *(short *)pauVar21[1] = sVar24;
    *(short *)(pauVar21[1] + 2) = sVar24;
    *(short *)(pauVar21[1] + 4) = (short)uVar25;
    auVar35 = vpshuflw_avx(auVar41,0xec);
    *(int *)(pauVar21[1] + 6) = auVar35._0_4_;
    vpextrw_avx(auVar41,2);
    *(short *)(pauVar21[1] + 0xc) = sVar24 + 3;
    *(short *)(pauVar21[1] + 0xe) = sVar24 + 3;
    *(short *)pauVar21[2] = (short)uVar25 + 3;
    vpextrw_avx(auVar41,3);
    pauVar21 = (undefined1 (*) [16])(pauVar21[2] + 4);
    this->_IdxWritePtr = (ImDrawIdx *)pauVar21;
    uVar27 = uVar25;
  }
  for (lVar18 = 0; uVar14 << 5 != lVar18; lVar18 = lVar18 + 0x20) {
    this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar15 + lVar18 + uVar14 * 8);
    this->_VtxWritePtr->uv = IVar8;
    pIVar9 = this->_VtxWritePtr;
    pIVar9->col = local_44;
    pIVar9[1].pos = *(ImVec2 *)((long)puVar15 + lVar18 + uVar14 * 8 + 8);
    this->_VtxWritePtr[1].uv = IVar8;
    pIVar9 = this->_VtxWritePtr;
    pIVar9[1].col = col;
    pIVar9[2].pos = *(ImVec2 *)((long)puVar15 + lVar18 + uVar14 * 8 + 0x10);
    this->_VtxWritePtr[2].uv = IVar8;
    pIVar9 = this->_VtxWritePtr;
    pIVar9[2].col = col;
    pIVar9[3].pos = *(ImVec2 *)((long)puVar15 + lVar18 + uVar14 * 8 + 0x18);
    this->_VtxWritePtr[3].uv = IVar8;
    pIVar9 = this->_VtxWritePtr;
    pIVar9[3].col = local_44;
    this->_VtxWritePtr = pIVar9 + 4;
  }
LAB_001785f0:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_50;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}